

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaParser.cpp
# Opt level: O1

bool __thiscall ParsedH265TrackData::spsppsExists(ParsedH265TrackData *this,uint8_t *buff,int size)

{
  byte bVar1;
  uint32_t uVar2;
  ulong uVar3;
  byte bVar4;
  uint32_t *cur32;
  uint32_t *puVar5;
  byte bVar6;
  bool bVar7;
  byte bVar8;
  byte bVar9;
  
  uVar3 = (ulong)(this->super_ParsedH264TrackData).m_nalSize;
  if (buff < buff + ((long)size - uVar3)) {
    bVar6 = 0;
    bVar8 = 0;
    bVar9 = 0;
    puVar5 = (uint32_t *)buff;
    do {
      if ((char)uVar3 == '\x04') {
        uVar2 = my_ntohl(*puVar5);
      }
      else {
        uVar2 = (uint)*(byte *)((long)puVar5 + 2) |
                (uint)*(byte *)((long)puVar5 + 1) << 8 | (uint)(byte)*puVar5 << 0x10;
      }
      bVar1 = (this->super_ParsedH264TrackData).m_nalSize;
      bVar4 = *(byte *)((long)puVar5 + (ulong)bVar1) >> 1 & 0x3f;
      if (bVar4 == 0x20) {
        bVar6 = 1;
      }
      else if (bVar4 == 0x22) {
        bVar8 = 1;
      }
      else if (bVar4 == 0x21) {
        bVar9 = 1;
      }
      puVar5 = (uint32_t *)((long)puVar5 + (ulong)(uVar2 + bVar1));
      uVar3 = (ulong)(this->super_ParsedH264TrackData).m_nalSize;
    } while (puVar5 < buff + ((long)size - uVar3));
    bVar7 = (bool)(bVar6 & bVar9 & bVar8);
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool ParsedH265TrackData::spsppsExists(uint8_t* buff, const int size)
{
    uint8_t* curPos = buff;
    const uint8_t* end = buff + size;
    bool vpsFound = false;
    bool spsFound = false;
    bool ppsFound = false;
    while (curPos < end - m_nalSize)
    {
        uint32_t elSize;
        if (m_nalSize == 4)
        {
            const auto cur32 = reinterpret_cast<uint32_t*>(curPos);
            elSize = my_ntohl(*cur32);
        }
        else
            elSize = (curPos[0] << 16l) + (curPos[1] << 8l) + curPos[2];
        const auto nalUnitType = static_cast<HevcUnit::NalType>((curPos[m_nalSize] >> 1) & 0x3f);
        if (nalUnitType == HevcUnit::NalType::VPS)
            vpsFound = true;
        else if (nalUnitType == HevcUnit::NalType::SPS)
            spsFound = true;
        else if (nalUnitType == HevcUnit::NalType::PPS)
            ppsFound = true;
        curPos += elSize + m_nalSize;
    }
    return vpsFound && spsFound && ppsFound;
}